

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void compact_alphabet(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  uint *puVar1;
  uint *puVar2;
  uint *v;
  uint *puVar3;
  pointer puVar4;
  uint *puVar5;
  uchar uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> elems;
  allocator_type local_21;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  puVar3 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = puVar3 + 1;
  if (puVar5 != puVar1 && puVar3 != puVar1) {
    do {
      puVar2 = puVar5;
      if (*puVar5 <= *puVar3) {
        puVar2 = puVar3;
      }
      puVar3 = puVar2;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_20,(ulong)(*puVar3 + 1),&local_21);
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[*puVar3] = '\x01';
  }
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = '\0';
    puVar4 = local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (*puVar4 != '\0') {
        *puVar4 = uVar6;
        uVar6 = uVar6 + '\x01';
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    *puVar3 = (uint)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[*puVar3];
  }
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void compact_alphabet(std::vector<uint32_t>& vec)
{
    uint32_t max_elem = *std::max_element(vec.begin(), vec.end());
    std::vector<uint8_t> elems(max_elem + 1);
    for (const auto& v : vec)
        elems[v] = 1;
    uint32_t cur = 0;
    for (auto& v : elems) {
        if (v != 0) {
            v = cur;
            cur++;
        }
    }
    for (auto& x : vec)
        x = elems[x];
}